

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha256_compile(sha256_ctx *ctx)

{
  sha2_32t sVar1;
  sha2_32t sVar2;
  sha2_32t sVar3;
  uint uVar4;
  sha2_32t sVar5;
  sha2_32t sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  sha2_32t sVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  sha2_32t sVar18;
  sha2_32t sVar19;
  uint uVar20;
  uint uVar21;
  sha2_32t sVar22;
  uint uVar23;
  uint uVar24;
  sha2_32t sVar25;
  int iVar26;
  uint uVar27;
  sha2_32t sVar28;
  
  sVar1 = ctx->hash[0];
  sVar2 = ctx->hash[1];
  sVar3 = ctx->hash[2];
  uVar4 = ctx->hash[3];
  sVar5 = ctx->hash[4];
  sVar6 = ctx->hash[5];
  uVar7 = ctx->hash[6];
  uVar8 = ctx->hash[7];
  uVar14 = 0xfffffffffffffff0;
  uVar15 = uVar4;
  sVar19 = sVar5;
  sVar18 = sVar6;
  uVar24 = uVar7;
  sVar22 = sVar1;
  sVar28 = sVar2;
  sVar25 = sVar3;
  uVar21 = uVar8;
  do {
    if (uVar14 == 0xfffffffffffffff0) {
      sVar11 = ctx->wbuf[0];
    }
    else {
      uVar9 = ctx->wbuf[0xe];
      uVar23 = ctx->wbuf[1];
      sVar11 = (uVar9 >> 10 ^ (uVar9 << 0xd | uVar9 >> 0x13) ^ (uVar9 << 0xf | uVar9 >> 0x11)) +
               ctx->wbuf[9] + ctx->wbuf[0] +
               (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7));
      ctx->wbuf[0] = sVar11;
    }
    iVar16 = ((sVar18 ^ uVar24) & sVar19 ^ uVar24) + uVar21 +
             ((sVar19 << 7 | sVar19 >> 0x19) ^
             (sVar19 << 0x15 | sVar19 >> 0xb) ^ (sVar19 << 0x1a | sVar19 >> 6)) + sVar11 +
             k256[uVar14 + 0x10];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar11 = ctx->wbuf[1];
    }
    else {
      uVar21 = ctx->wbuf[0xf];
      uVar9 = ctx->wbuf[2];
      sVar11 = (uVar21 >> 10 ^ (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11))
               + ctx->wbuf[10] + ctx->wbuf[1] +
               (uVar9 >> 3 ^ (uVar9 << 0xe | uVar9 >> 0x12) ^ (uVar9 << 0x19 | uVar9 >> 7));
      ctx->wbuf[1] = sVar11;
    }
    uVar15 = uVar15 + iVar16;
    iVar13 = ((sVar19 ^ sVar18) & uVar15 ^ sVar18) + uVar24 + sVar11 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
             k256[uVar14 + 0x11];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar11 = ctx->wbuf[2];
    }
    else {
      uVar21 = ctx->wbuf[0];
      uVar24 = ctx->wbuf[3];
      sVar11 = (uVar21 >> 10 ^ (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11))
               + ctx->wbuf[0xb] + ctx->wbuf[2] +
               (uVar24 >> 3 ^ (uVar24 << 0xe | uVar24 >> 0x12) ^ (uVar24 << 0x19 | uVar24 >> 7));
      ctx->wbuf[2] = sVar11;
    }
    uVar21 = iVar13 + sVar25;
    iVar17 = ((uVar15 ^ sVar19) & uVar21 ^ sVar19) + sVar18 + sVar11 +
             ((uVar21 * 0x80 | uVar21 >> 0x19) ^
             (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) +
             k256[uVar14 + 0x12];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar18 = ctx->wbuf[3];
    }
    else {
      uVar24 = ctx->wbuf[1];
      uVar9 = ctx->wbuf[4];
      sVar18 = (uVar24 >> 10 ^ (uVar24 << 0xd | uVar24 >> 0x13) ^ (uVar24 << 0xf | uVar24 >> 0x11))
               + ctx->wbuf[0xc] + ctx->wbuf[3] +
               (uVar9 >> 3 ^ (uVar9 << 0xe | uVar9 >> 0x12) ^ (uVar9 << 0x19 | uVar9 >> 7));
      ctx->wbuf[3] = sVar18;
    }
    uVar24 = iVar17 + sVar28;
    iVar12 = ((uVar21 ^ uVar15) & uVar24 ^ uVar15) + sVar19 + sVar18 +
             ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
             k256[uVar14 + 0x13];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[4];
    }
    else {
      uVar9 = ctx->wbuf[2];
      uVar23 = ctx->wbuf[5];
      sVar19 = (uVar9 >> 10 ^ (uVar9 << 0xd | uVar9 >> 0x13) ^ (uVar9 << 0xf | uVar9 >> 0x11)) +
               ctx->wbuf[0xd] + ctx->wbuf[4] +
               (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7));
      ctx->wbuf[4] = sVar19;
    }
    uVar9 = iVar12 + sVar22;
    iVar26 = ((uVar24 ^ uVar21) & uVar9 ^ uVar21) + uVar15 + sVar19 +
             ((uVar9 * 0x80 | uVar9 >> 0x19) ^
             (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
             k256[uVar14 + 0x14];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[5];
    }
    else {
      uVar15 = ctx->wbuf[3];
      uVar23 = ctx->wbuf[6];
      sVar19 = (uVar15 >> 10 ^ (uVar15 << 0xd | uVar15 >> 0x13) ^ (uVar15 << 0xf | uVar15 >> 0x11))
               + ctx->wbuf[0xe] + ctx->wbuf[5] +
               (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7));
      ctx->wbuf[5] = sVar19;
    }
    uVar23 = (sVar25 & sVar28 ^ (sVar28 ^ sVar25) & sVar22) +
             ((sVar22 << 10 | sVar22 >> 0x16) ^
             (sVar22 << 0x13 | sVar22 >> 0xd) ^ (sVar22 << 0x1e | sVar22 >> 2)) + iVar16;
    uVar15 = iVar26 + uVar23;
    iVar16 = ((uVar9 ^ uVar24) & uVar15 ^ uVar24) + uVar21 + sVar19 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
             k256[uVar14 + 0x15];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[6];
    }
    else {
      uVar21 = ctx->wbuf[4];
      uVar27 = ctx->wbuf[7];
      sVar19 = (uVar21 >> 10 ^ (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11))
               + ctx->wbuf[0xf] + ctx->wbuf[6] +
               (uVar27 >> 3 ^ (uVar27 << 0xe | uVar27 >> 0x12) ^ (uVar27 << 0x19 | uVar27 >> 7));
      ctx->wbuf[6] = sVar19;
    }
    uVar27 = ((sVar28 ^ sVar22) & uVar23 ^ sVar22 & sVar28) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar13;
    uVar21 = uVar27 + iVar16;
    iVar13 = ((uVar15 ^ uVar9) & uVar21 ^ uVar9) + uVar24 + sVar19 +
             ((uVar21 * 0x80 | uVar21 >> 0x19) ^
             (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) +
             k256[uVar14 + 0x16];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[7];
    }
    else {
      uVar24 = ctx->wbuf[5];
      uVar20 = ctx->wbuf[8];
      sVar19 = (uVar24 >> 10 ^ (uVar24 << 0xd | uVar24 >> 0x13) ^ (uVar24 << 0xf | uVar24 >> 0x11))
               + ctx->wbuf[0] + ctx->wbuf[7] +
               (uVar20 >> 3 ^ (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7));
      ctx->wbuf[7] = sVar19;
    }
    uVar20 = ((sVar22 ^ uVar23) & uVar27 ^ uVar23 & sVar22) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar17;
    uVar24 = iVar13 + uVar20;
    iVar17 = ((uVar21 ^ uVar15) & uVar24 ^ uVar15) + uVar9 + sVar19 +
             ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
             k256[uVar14 + 0x17];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[8];
    }
    else {
      uVar9 = ctx->wbuf[6];
      uVar10 = ctx->wbuf[9];
      sVar19 = (uVar9 >> 10 ^ (uVar9 << 0xd | uVar9 >> 0x13) ^ (uVar9 << 0xf | uVar9 >> 0x11)) +
               ctx->wbuf[1] + ctx->wbuf[8] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[8] = sVar19;
    }
    uVar23 = ((uVar23 ^ uVar27) & uVar20 ^ uVar27 & uVar23) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar12;
    uVar9 = iVar17 + uVar23;
    iVar12 = ((uVar24 ^ uVar21) & uVar9 ^ uVar21) + uVar15 + sVar19 +
             ((uVar9 * 0x80 | uVar9 >> 0x19) ^
             (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
             k256[uVar14 + 0x18];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[9];
    }
    else {
      uVar15 = ctx->wbuf[7];
      uVar10 = ctx->wbuf[10];
      sVar19 = (uVar15 >> 10 ^ (uVar15 << 0xd | uVar15 >> 0x13) ^ (uVar15 << 0xf | uVar15 >> 0x11))
               + ctx->wbuf[2] + ctx->wbuf[9] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[9] = sVar19;
    }
    uVar27 = ((uVar27 ^ uVar20) & uVar23 ^ uVar20 & uVar27) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar26;
    uVar15 = iVar12 + uVar27;
    iVar26 = ((uVar9 ^ uVar24) & uVar15 ^ uVar24) + uVar21 + sVar19 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
             k256[uVar14 + 0x19];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[10];
    }
    else {
      uVar21 = ctx->wbuf[8];
      uVar10 = ctx->wbuf[0xb];
      sVar19 = (uVar21 >> 10 ^ (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11))
               + ctx->wbuf[3] + ctx->wbuf[10] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[10] = sVar19;
    }
    uVar21 = ((uVar20 ^ uVar23) & uVar27 ^ uVar23 & uVar20) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar16;
    uVar20 = iVar26 + uVar21;
    iVar16 = ((uVar15 ^ uVar9) & uVar20 ^ uVar9) + uVar24 + sVar19 +
             ((uVar20 * 0x80 | uVar20 >> 0x19) ^
             (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) +
             k256[uVar14 + 0x1a];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[0xb];
    }
    else {
      uVar24 = ctx->wbuf[9];
      uVar10 = ctx->wbuf[0xc];
      sVar19 = (uVar24 >> 10 ^ (uVar24 << 0xd | uVar24 >> 0x13) ^ (uVar24 << 0xf | uVar24 >> 0x11))
               + ctx->wbuf[4] + ctx->wbuf[0xb] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[0xb] = sVar19;
    }
    uVar24 = ((uVar23 ^ uVar27) & uVar21 ^ uVar27 & uVar23) +
             ((uVar21 * 0x400 | uVar21 >> 0x16) ^
             (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar13;
    uVar23 = iVar16 + uVar24;
    iVar13 = ((uVar20 ^ uVar15) & uVar23 ^ uVar15) + uVar9 + sVar19 +
             ((uVar23 * 0x80 | uVar23 >> 0x19) ^
             (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
             k256[uVar14 + 0x1b];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[0xc];
    }
    else {
      uVar9 = ctx->wbuf[10];
      uVar10 = ctx->wbuf[0xd];
      sVar19 = (uVar9 >> 10 ^ (uVar9 << 0xd | uVar9 >> 0x13) ^ (uVar9 << 0xf | uVar9 >> 0x11)) +
               ctx->wbuf[5] + ctx->wbuf[0xc] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[0xc] = sVar19;
    }
    uVar27 = ((uVar27 ^ uVar21) & uVar24 ^ uVar21 & uVar27) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar17;
    uVar9 = iVar13 + uVar27;
    iVar17 = ((uVar23 ^ uVar20) & uVar9 ^ uVar20) + uVar15 + sVar19 +
             ((uVar9 * 0x80 | uVar9 >> 0x19) ^
             (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
             k256[uVar14 + 0x1c];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[0xd];
    }
    else {
      uVar15 = ctx->wbuf[0xb];
      uVar10 = ctx->wbuf[0xe];
      sVar19 = (uVar15 >> 10 ^ (uVar15 << 0xd | uVar15 >> 0x13) ^ (uVar15 << 0xf | uVar15 >> 0x11))
               + ctx->wbuf[6] + ctx->wbuf[0xd] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[0xd] = sVar19;
    }
    uVar15 = ((uVar21 ^ uVar24) & uVar27 ^ uVar24 & uVar21) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar12;
    uVar21 = iVar17 + uVar15;
    iVar12 = ((uVar9 ^ uVar23) & uVar21 ^ uVar23) + uVar20 + sVar19 +
             ((uVar21 * 0x80 | uVar21 >> 0x19) ^
             (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) +
             k256[uVar14 + 0x1d];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[0xe];
    }
    else {
      uVar20 = ctx->wbuf[0xc];
      uVar10 = ctx->wbuf[0xf];
      sVar19 = (uVar20 >> 10 ^ (uVar20 << 0xd | uVar20 >> 0x13) ^ (uVar20 << 0xf | uVar20 >> 0x11))
               + ctx->wbuf[7] + ctx->wbuf[0xe] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[0xe] = sVar19;
    }
    uVar20 = ((uVar24 ^ uVar27) & uVar15 ^ uVar27 & uVar24) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar26;
    uVar24 = iVar12 + uVar20;
    iVar26 = ((uVar21 ^ uVar9) & uVar24 ^ uVar9) + uVar23 + sVar19 +
             ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
             k256[uVar14 + 0x1e];
    if (uVar14 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[0xf];
    }
    else {
      uVar23 = ctx->wbuf[0xd];
      uVar10 = ctx->wbuf[0];
      sVar19 = (uVar23 >> 10 ^ (uVar23 << 0xd | uVar23 >> 0x13) ^ (uVar23 << 0xf | uVar23 >> 0x11))
               + ctx->wbuf[8] + ctx->wbuf[0xf] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[0xf] = sVar19;
    }
    uVar27 = ((uVar27 ^ uVar15) & uVar20 ^ uVar15 & uVar27) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar16;
    uVar23 = ((uVar15 ^ uVar20) & uVar27 ^ uVar20 & uVar15) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar13;
    uVar15 = ((uVar20 ^ uVar27) & uVar23 ^ uVar27 & uVar20) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar17;
    sVar25 = ((uVar23 ^ uVar27) & uVar15 ^ uVar23 & uVar27) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
    sVar18 = uVar27 + iVar26;
    sVar28 = ((uVar15 ^ uVar23) & sVar25 ^ uVar15 & uVar23) +
             ((sVar25 * 0x400 | sVar25 >> 0x16) ^
             (sVar25 * 0x80000 | sVar25 >> 0xd) ^ (sVar25 * 0x40000000 | sVar25 >> 2)) + iVar26;
    iVar16 = ((uVar24 ^ uVar21) & sVar18 ^ uVar21) + uVar9 + sVar19 +
             ((sVar18 * 0x80 | sVar18 >> 0x19) ^
             (sVar18 * 0x200000 | sVar18 >> 0xb) ^ (sVar18 * 0x4000000 | sVar18 >> 6)) +
             k256[uVar14 + 0x1f];
    sVar19 = uVar23 + iVar16;
    sVar22 = ((sVar25 ^ uVar15) & sVar28 ^ sVar25 & uVar15) +
             ((sVar28 * 0x400 | sVar28 >> 0x16) ^
             (sVar28 * 0x80000 | sVar28 >> 0xd) ^ (sVar28 * 0x40000000 | sVar28 >> 2)) + iVar16;
    uVar14 = uVar14 + 0x10;
  } while (uVar14 < 0x30);
  ctx->hash[0] = sVar22 + sVar1;
  ctx->hash[1] = sVar28 + sVar2;
  ctx->hash[2] = sVar25 + sVar3;
  ctx->hash[3] = uVar15 + uVar4;
  ctx->hash[4] = sVar19 + sVar5;
  ctx->hash[5] = sVar18 + sVar6;
  ctx->hash[6] = uVar24 + uVar7;
  ctx->hash[7] = uVar21 + uVar8;
  return;
}

Assistant:

void sha256_compile(sha256_ctx ctx[1])
{   sha2_32t    v[8], j;

    memcpy(v, ctx->hash, 8 * sizeof(sha2_32t));

    for(j = 0; j < 64; j += 16)
    {
        h2_cycle( 0, j); h2_cycle( 1, j); h2_cycle( 2, j); h2_cycle( 3, j);
        h2_cycle( 4, j); h2_cycle( 5, j); h2_cycle( 6, j); h2_cycle( 7, j);
        h2_cycle( 8, j); h2_cycle( 9, j); h2_cycle(10, j); h2_cycle(11, j);
        h2_cycle(12, j); h2_cycle(13, j); h2_cycle(14, j); h2_cycle(15, j);
    }

    ctx->hash[0] += v[0]; ctx->hash[1] += v[1]; ctx->hash[2] += v[2]; ctx->hash[3] += v[3];
    ctx->hash[4] += v[4]; ctx->hash[5] += v[5]; ctx->hash[6] += v[6]; ctx->hash[7] += v[7];
}